

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_lz4.c
# Opt level: O0

int verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  undefined4 uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  mode_t mVar6;
  wchar_t wVar7;
  time_t tVar8;
  time_t tVar9;
  char *v2;
  ulong local_40;
  size_t i;
  archive_entry *ae;
  archive *a;
  fns *fns_local;
  uchar *puStack_18;
  vtype type_local;
  size_t used_local;
  uchar *buff_local;
  
  fns_local._4_4_ = (vtype)siglen;
  a = (archive *)tbs;
  puStack_18 = sig;
  used_local = (size_t)ctx;
  ae = (archive_entry *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'\x96',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar5 = archive_read_support_format_all((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'\x97',0,"0",(long)iVar5,"archive_read_support_format_all(a)",ae);
  iVar5 = archive_read_support_filter_all((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'\x98',0,"0",(long)iVar5,"archive_read_support_filter_all(a)",ae);
  if (fns_local._4_4_ != ROCKRIDGE) {
    iVar5 = archive_read_set_option((archive *)ae,(char *)0x0,"rockridge",(char *)0x0);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,L'\x9b',(uint)(iVar5 == 0),
                     "0 == archive_read_set_option(a, NULL, \"rockridge\", NULL)",ae);
  }
  if (JOLIET < fns_local._4_4_) {
    iVar5 = archive_read_set_option((archive *)ae,(char *)0x0,"joliet",(char *)0x0);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,L'\x9e',(uint)(iVar5 == 0),
                     "0 == archive_read_set_option(a, NULL, \"joliet\", NULL)",ae);
  }
  iVar5 = archive_read_open_memory((archive *)ae,(void *)used_local,(size_t)puStack_18);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'\x9f',0,"0",(long)iVar5,"archive_read_open_memory(a, buff, used)",ae);
  iVar5 = archive_read_next_header((archive *)ae,(archive_entry **)&i);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'¥',0,"0",(long)iVar5,"archive_read_next_header(a, &ae)",ae);
  tVar8 = archive_entry_atime((archive_entry *)i);
  tVar9 = archive_entry_ctime((archive_entry *)i);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'¦',tVar8,"archive_entry_atime(ae)",tVar9,"archive_entry_ctime(ae)",
                      (void *)0x0);
  tVar8 = archive_entry_atime((archive_entry *)i);
  tVar9 = archive_entry_mtime((archive_entry *)i);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'§',tVar8,"archive_entry_atime(ae)",tVar9,"archive_entry_mtime(ae)",
                      (void *)0x0);
  v2 = archive_entry_pathname((archive_entry *)i);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
             ,L'¨',".","\".\"",v2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  if (fns_local._4_4_ == ROCKRIDGE) {
    mVar6 = archive_entry_mode((archive_entry *)i);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,L'«',(uint)(mVar6 == 0x416d),"(S_IFDIR | 0555) == archive_entry_mode(ae)",
                     (void *)0x0);
  }
  else if (fns_local._4_4_ == JOLIET) {
    mVar6 = archive_entry_mode((archive_entry *)i);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,L'®',(uint)(mVar6 == 0x41c0),"(S_IFDIR | 0700) == archive_entry_mode(ae)",
                     (void *)0x0);
  }
  else if (fns_local._4_4_ == ISO9660) {
    mVar6 = archive_entry_mode((archive_entry *)i);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,L'±',(uint)(mVar6 == 0x41c0),"(S_IFDIR | 0700) == archive_entry_mode(ae)",
                     (void *)0x0);
  }
  lVar2._0_4_ = a->file_count;
  lVar2._4_4_ = a->archive_error_number;
  memset((a->error_string).s,0,lVar2 << 3);
  *(undefined4 *)&a->error = 0;
  for (local_40 = 0; uVar3._0_4_ = a->file_count, uVar3._4_4_ = a->archive_error_number,
      local_40 < uVar3; local_40 = local_40 + 1) {
    verify_file((archive *)ae,fns_local._4_4_,(fns *)a);
  }
  for (local_40 = 0; uVar4._0_4_ = a->file_count, uVar4._4_4_ = a->archive_error_number,
      local_40 < uVar4; local_40 = local_40 + 1) {
    free(*(void **)((a->error_string).s + local_40 * 8));
  }
  uVar1 = a->magic;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'¾',(long)(int)a->vtable,"(int)fns->longest_len",(long)(int)uVar1,
                      "(int)fns->maxlen",(void *)0x0);
  iVar5 = archive_read_next_header((archive *)ae,(archive_entry **)&i);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'Ã',1,"ARCHIVE_EOF",(long)iVar5,"archive_read_next_header(a, &ae)",ae);
  iVar5 = archive_read_close((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'Ä',0,"ARCHIVE_OK",(long)iVar5,"archive_read_close(a)",ae);
  iVar5 = archive_read_free((archive *)ae);
  wVar7 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                              ,L'Å',0,"ARCHIVE_OK",(long)iVar5,"archive_read_free(a)",ae);
  return wVar7;
}

Assistant:

static void
verify(const char *name, const char *n[])
{
	struct archive_entry *ae;
	struct archive *a;
	int i,r;

	assert((a = archive_read_new()) != NULL);
	r = archive_read_support_filter_lz4(a);
	if (r == ARCHIVE_WARN) {
		skipping("lz4 reading not fully supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, r);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	copy_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 200));

	/* Read entries, match up names with list above. */
	for (i = 0; n[i] != NULL; ++i) {
		failure("Could not read file %d (%s) from %s", i, n[i], name);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_next_header(a, &ae));
		if (r != ARCHIVE_OK) {
			archive_read_free(a);
			return;
		}
		assertEqualString(n[i], archive_entry_pathname(ae));
	}

	/* Verify the end-of-archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_LZ4);
	assertEqualString(archive_filter_name(a, 0), "lz4");
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_USTAR);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}